

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>
::dx(FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>
     *this,int i)

{
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  *pFVar1;
  Fad<double> *pFVar2;
  Fad<double> *pFVar3;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar4;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar5;
  double *pdVar6;
  double *pdVar7;
  value_type vVar8;
  double dVar9;
  
  pFVar1 = this->left_;
  vVar8 = FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>::dx
                    (&((pFVar1->fadexpr_).right_)->fadexpr_,i);
  pFVar2 = (this->right_->fadexpr_).left_;
  pFVar3 = (this->right_->fadexpr_).right_;
  dVar9 = pFVar2->val_ + pFVar3->val_;
  pdVar7 = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    pdVar7 = (pFVar2->dx_).ptr_to_data + i;
  }
  pdVar6 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pdVar6 = (pFVar3->dx_).ptr_to_data + i;
  }
  pFVar4 = (this->left_->fadexpr_).right_;
  pFVar5 = (pFVar4->fadexpr_).left_;
  return (vVar8 * (pFVar1->fadexpr_).left_.constant_ * dVar9 -
         (((pFVar5->fadexpr_).left_)->val_ * ((pFVar5->fadexpr_).right_)->val_ +
         ((pFVar4->fadexpr_).right_)->val_) * (this->left_->fadexpr_).left_.constant_ *
         (*pdVar7 + *pdVar6)) / (dVar9 * dVar9);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}